

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O0

optional<metaf::Distance> * metaf::Distance::fromMileString(string *s,bool remarkFormat)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  Modifier *pMVar4;
  long lVar5;
  type_conflict2 *ptVar6;
  byte in_DL;
  ulong in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  type_conflict2 denominator;
  type_conflict2 numerator;
  uint integer;
  optional<std::pair<unsigned_int,_unsigned_int>_> fraction;
  size_t fracLength;
  size_t intPos_1;
  optional<unsigned_int> dist;
  size_t intLength;
  size_t intPos;
  optional<metaf::Distance::Modifier> modifier;
  Distance distance;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  size_type local_100;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  uint local_b8;
  uint local_b4;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  string local_50 [36];
  Modifier local_2c;
  undefined4 local_20;
  allocator<char> local_a;
  byte local_9;
  ulong local_8;
  
  local_9 = in_DL & 1;
  this = in_RDI;
  local_8 = in_RSI;
  if ((fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_ == '\0') &&
     (iVar2 = __cxa_guard_acquire(&fromMileString(std::__cxx11::string_const&,bool)::
                                   unitStr_abi_cxx11_), iVar2 != 0)) {
    __a = &local_a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(this,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_a);
    __cxa_atexit(std::__cxx11::string::~string,
                 &fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_,&__dso_handle
                );
    __cxa_guard_release(&fromMileString(std::__cxx11::string_const&,bool)::unitStr_abi_cxx11_);
  }
  if ((fromMileString(std::__cxx11::string_const&,bool)::unitLength == '\0') &&
     (iVar2 = __cxa_guard_acquire(&fromMileString(std::__cxx11::string_const&,bool)::unitLength),
     iVar2 != 0)) {
    fromMileString::unitLength = std::__cxx11::string::length();
    __cxa_guard_release(&fromMileString(std::__cxx11::string_const&,bool)::unitLength);
  }
  Distance((Distance *)in_stack_fffffffffffffef0);
  local_20 = 1;
  if ((local_9 & 1) == 0) {
    uVar3 = std::__cxx11::string::length();
    if (uVar3 < fromMileString::unitLength + 1) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
    bVar1 = std::operator==(in_stack_fffffffffffffef0,
                            (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    uVar3 = local_8;
    if (bVar1) {
      std::optional<metaf::Distance>::optional<metaf::Distance,_true>
                ((optional<metaf::Distance> *)in_stack_fffffffffffffef0,
                 (Distance *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      return (optional<metaf::Distance> *)this;
    }
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)local_50,uVar3);
    bVar1 = std::operator!=(in_stack_fffffffffffffef0,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    std::__cxx11::string::~string(local_50);
    if (bVar1) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
  }
  else {
    lVar5 = std::__cxx11::string::length();
    if (lVar5 == 0) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
  }
  std::__cxx11::string::operator[](local_8);
  modifierFromChar((char)((uint)in_stack_fffffffffffffeec >> 0x18));
  bVar1 = std::optional<metaf::Distance::Modifier>::has_value
                    ((optional<metaf::Distance::Modifier> *)0x244e55);
  if (bVar1) {
    pMVar4 = std::optional<metaf::Distance::Modifier>::operator*
                       ((optional<metaf::Distance::Modifier> *)0x244e68);
    local_2c = *pMVar4;
  }
  lVar5 = std::__cxx11::string::find((char)local_8,0x2f);
  if (lVar5 == -1) {
    bVar1 = std::optional<metaf::Distance::Modifier>::has_value
                      ((optional<metaf::Distance::Modifier> *)0x244e9e);
    lVar5 = std::__cxx11::string::length();
    if ((local_9 & 1) == 0) {
      local_100 = fromMileString::unitLength;
    }
    else {
      local_100 = 0;
    }
    if ((lVar5 - local_100 == (ulong)bVar1) || (2 < (lVar5 - local_100) - (ulong)bVar1)) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
    strToUint((string *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),(size_t)this,
              (size_t)in_RDI);
    bVar1 = std::optional<unsigned_int>::has_value((optional<unsigned_int> *)0x244f69);
    if (!bVar1) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
    std::optional<unsigned_int>::operator*((optional<unsigned_int> *)0x244fa2);
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)in_stack_fffffffffffffef0,
               (uint *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  else {
    bVar1 = std::optional<metaf::Distance::Modifier>::has_value
                      ((optional<metaf::Distance::Modifier> *)0x244fe6);
    lVar5 = std::__cxx11::string::length();
    in_stack_fffffffffffffef0 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         fromMileString::unitLength;
    if ((local_9 & 1) != 0) {
      in_stack_fffffffffffffef0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
    fractionStrToUint((string *)((lVar5 - (long)in_stack_fffffffffffffef0) - (ulong)bVar1),
                      CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                      CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    bVar1 = std::optional<std::pair<unsigned_int,_unsigned_int>_>::has_value
                      ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x245089);
    if (!bVar1) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
    local_b4 = 0;
    std::optional<std::pair<unsigned_int,_unsigned_int>_>::operator*
              ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x2450c7);
    ptVar6 = std::get<0ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x2450cf);
    local_b8 = *ptVar6;
    std::optional<std::pair<unsigned_int,_unsigned_int>_>::operator*
              ((optional<std::pair<unsigned_int,_unsigned_int>_> *)0x2450df);
    ptVar6 = std::get<1ul,unsigned_int,unsigned_int>((pair<unsigned_int,_unsigned_int> *)0x2450e7);
    if ((local_b8 == 0) || (*ptVar6 == 0)) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
    if (*ptVar6 <= local_b8) {
      local_b4 = local_b8 / 10;
      local_b8 = local_b8 % 10;
    }
    if (local_b8 == 0) {
      *(undefined8 *)in_RDI = 0;
      in_RDI->_M_string_length = 0;
      *(undefined4 *)&in_RDI->field_2 = 0;
      return (optional<metaf::Distance> *)this;
    }
    in_stack_fffffffffffffeec = local_b4 * 10000;
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)in_stack_fffffffffffffef0,
               (uint *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  }
  std::optional<metaf::Distance>::optional<metaf::Distance,_true>
            ((optional<metaf::Distance> *)in_stack_fffffffffffffef0,
             (Distance *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  return (optional<metaf::Distance> *)this;
}

Assistant:

std::optional<Distance> Distance::fromMileString(const std::string & s, 
	bool remarkFormat)
{
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?SM|////SM");
	// static const std::regex rgx ("([PM])?(\\d?\\d)(?:/(\\d?\\d))?");
	static const std::optional<Distance> error;
	static const auto unitStr = std::string ("SM");
	static const auto unitLength = unitStr.length();

	Distance distance;
	distance.distUnit = Unit::STATUTE_MILES;
	if (!remarkFormat) {
		if (s.length() < unitLength + 1) return error; //1 digit minimum
		if (s == "////SM") return distance;
		if (s.substr(s.length() - unitLength, unitLength) != unitStr) return error; //s.endsWith(unitStr)
	} else {
		if (s.length() < 1) return error; //1 digit minimum
	}
	const auto modifier = modifierFromChar(s[0]);
	if (modifier.has_value()) {
		distance.distModifier = *modifier;
	}

	if (s.find('/') == std::string::npos) {
		//The value is integer, e.g. 3SM or 15SM
		const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t intLength = s.length() -
			(remarkFormat ? 0 : unitLength) -
            intPos;
		static const int minDigits = 1, maxDigits = 2;
		if (intLength < minDigits || intLength > maxDigits) return error;
		const auto dist = strToUint(s, intPos, intLength);
		if (!dist.has_value()) return error;
		distance.dist = *dist * statuteMileFactor;
	} else {
		//Fraction value, e.g. 1/2SM, 11/2SM, 5/16SM, 11/16SM
        const std::size_t intPos = std::size_t(modifier.has_value());
		const std::size_t fracLength = s.length() -
			(remarkFormat ? 0: unitLength) -
			intPos;
		const auto fraction = fractionStrToUint(s,
                                                intPos,
                                                fracLength);
		if (!fraction.has_value()) return error;
		auto integer = 0u;
		auto numerator = std::get<0>(*fraction);
		auto denominator = std::get<1>(*fraction);
		if (!numerator || !denominator) return error;
		if (numerator >= denominator) { //e.g. 11/2SM = 1 1/2SM
			static const auto decimalRadix = 10u;
			integer = numerator / decimalRadix;
			numerator = numerator % decimalRadix;
		}
		if (!numerator) return error;
		distance.dist = 
			integer * statuteMileFactor + 
			numerator * statuteMileFactor / denominator;
	}
	return distance;
}